

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::parse_multipart_boundary(string *content_type,string *boundary)

{
  bool bVar1;
  string local_48 [32];
  long local_28;
  size_type pos;
  string *boundary_local;
  string *content_type_local;
  
  pos = (size_type)boundary;
  boundary_local = content_type;
  local_28 = std::__cxx11::string::find((char *)content_type,0x22cf47);
  bVar1 = local_28 != -1;
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)boundary_local);
    std::__cxx11::string::operator=((string *)pos,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return bVar1;
}

Assistant:

inline bool parse_multipart_boundary(const std::string& content_type, std::string& boundary)
{
    auto pos = content_type.find("boundary=");
    if (pos == std::string::npos) {
        return false;
    }

    boundary = content_type.substr(pos + 9);
    return true;
}